

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O3

void gola_close(LexState *ls,VarInfo *vg)

{
  ushort uVar1;
  long lVar2;
  undefined1 in_DL;
  BCPos list;
  ulong uVar3;
  
  lVar2 = *(long *)&(ls->sb).L;
  uVar3 = (ulong)vg & 0xffffffff;
  *(undefined1 *)(lVar2 + 1 + uVar3 * 8) = in_DL;
  if (*(char *)(lVar2 + uVar3 * 8) == 'X') {
    uVar1 = *(ushort *)(*(long *)&(ls->sb).L + 2 + uVar3 * 8);
    list = ((BCPos)vg + (uint)uVar1) - 0x7fff;
    if (list != 0xffffffff && uVar1 != 0x7fff) {
      jmp_patch((FuncState *)ls,list,(BCPos)vg);
    }
    *(undefined1 *)(lVar2 + uVar3 * 8) = 0x32;
    *(undefined2 *)(lVar2 + 2 + uVar3 * 8) = 0x7fff;
  }
  return;
}

Assistant:

static void gola_close(LexState *ls, VarInfo *vg)
{
  FuncState *fs = ls->fs;
  BCPos pc = vg->startpc;
  BCIns *ip = &fs->bcbase[pc].ins;
  lj_assertFS(gola_isgoto(vg), "expected goto");
  lj_assertFS(bc_op(*ip) == BC_JMP || bc_op(*ip) == BC_UCLO,
	      "bad bytecode op %d", bc_op(*ip));
  setbc_a(ip, vg->slot);
  if (bc_op(*ip) == BC_JMP) {
    BCPos next = jmp_next(fs, pc);
    if (next != NO_JMP) jmp_patch(fs, next, pc);  /* Jump to UCLO. */
    setbc_op(ip, BC_UCLO);  /* Turn into UCLO. */
    setbc_j(ip, NO_JMP);
  }
}